

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inst_debug_printf_pass.cpp
# Opt level: O1

uint32_t __thiscall
spvtools::opt::InstDebugPrintfPass::GetStreamWriteFunctionId
          (InstDebugPrintfPass *this,uint32_t param_cnt)

{
  uint uVar1;
  IRContext *pIVar2;
  TypeManager *this_00;
  const_iterator cVar3;
  _Rb_tree<unsigned_int,std::pair<unsigned_int_const,spvtools::opt::Instruction*>,std::_Select1st<std::pair<unsigned_int_const,spvtools::opt::Instruction*>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,spvtools::opt::Instruction*>>>
  *this_01;
  BasicBlock *pBVar4;
  undefined8 uVar5;
  undefined1 auVar6 [8];
  char cVar7;
  char cVar8;
  uint32_t uVar9;
  uint32_t uVar10;
  uint32_t uVar11;
  uint32_t uVar12;
  uint32_t uVar13;
  pointer __p;
  mapped_type *pmVar14;
  Type *pTVar15;
  Instruction *pIVar16;
  Instruction *this_02;
  BasicBlock *pBVar17;
  ulong uVar18;
  ulong uVar19;
  uint32_t func_id;
  IRContext *this_03;
  bool bVar20;
  unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_> new_blk_ptr
  ;
  unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_> output_func;
  string __str;
  string name;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
  write_label;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
  merge_label;
  InstructionBuilder builder;
  vector<unsigned_int,_std::allocator<unsigned_int>_> param_ids;
  vector<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
  param_types;
  Type *uint_type;
  uint32_t local_144;
  BasicBlock *local_140;
  undefined1 local_138 [24];
  BasicBlock *local_120;
  BasicBlock *local_118;
  IRContext *local_110;
  pair<const_unsigned_int,_spvtools::opt::Instruction_*> local_108;
  undefined1 local_f8 [16];
  __node_base local_e8 [2];
  _Hash_node_base local_d8 [2];
  undefined1 local_c8 [16];
  undefined1 local_b8 [8];
  undefined1 local_b0 [48];
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_80;
  vector<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
  local_68;
  Integer *local_50;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_48;
  
  this_03 = (IRContext *)&(this->super_InstrumentPass).param2output_func_id_;
  local_144 = param_cnt;
  pmVar14 = std::__detail::
            _Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
            ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          *)this_03,&local_144);
  if (*pmVar14 == 0) {
    uVar9 = Pass::TakeNextId((Pass *)this);
    pmVar14 = std::__detail::
              _Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)this_03,&local_144);
    *pmVar14 = uVar9;
    pIVar2 = (this->super_InstrumentPass).super_Pass.context_;
    if ((pIVar2->valid_analyses_ & kAnalysisTypes) == kAnalysisNone) {
      IRContext::BuildTypeManager(pIVar2);
    }
    this_00 = (pIVar2->type_mgr_)._M_t.
              super___uniq_ptr_impl<spvtools::opt::analysis::TypeManager,_std::default_delete<spvtools::opt::analysis::TypeManager>_>
              ._M_t.
              super__Tuple_impl<0UL,_spvtools::opt::analysis::TypeManager_*,_std::default_delete<spvtools::opt::analysis::TypeManager>_>
              .super__Head_base<0UL,_spvtools::opt::analysis::TypeManager_*,_false>._M_head_impl;
    local_50 = InstrumentPass::GetInteger(&this->super_InstrumentPass,0x20,false);
    std::
    vector<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
    ::vector(&local_68,(ulong)(local_144 + 2),(value_type *)&local_50,(allocator_type *)local_b0);
    local_b0._40_8_ = this_03;
    pmVar14 = std::__detail::
              _Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)this_03,&local_144);
    uVar1 = *pmVar14;
    local_b0._24_4_ = kAnalysisNone;
    local_b0._28_8_ = 0;
    local_b0._8_8_ = (pointer)0x0;
    local_b0._16_4_ = 0.0;
    local_b0._20_4_ = 0;
    local_b0._0_8_ = &PTR__Type_003ea9a0;
    pTVar15 = analysis::TypeManager::GetRegisteredType(this_00,(Type *)local_b0);
    local_b0._0_8_ = &PTR__Type_003e9e18;
    std::
    vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ::~vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               *)(local_b0 + 8));
    func_id = (uint32_t)this;
    InstrumentPass::StartFunction
              ((InstrumentPass *)local_138,func_id,(Type *)(ulong)uVar1,
               (vector<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
                *)pTVar15);
    InstrumentPass::AddParameters
              (&local_80,&this->super_InstrumentPass,(Function *)local_138._0_8_,&local_68);
    Pass::TakeNextId((Pass *)this);
    InstrumentPass::NewLabel((InstrumentPass *)local_b0,func_id);
    local_140 = (BasicBlock *)operator_new(0x88);
    local_140->function_ = (Function *)0x0;
    (local_140->label_)._M_t.
    super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
    ._M_t.
    super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
    .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl =
         (Instruction *)local_b0._0_8_;
    local_b0._16_8_ = &(local_140->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_
    ;
    (local_140->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
    super_IntrusiveNodeBase<spvtools::opt::Instruction>.next_node_ = (Instruction *)0x0;
    (local_140->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
    super_IntrusiveNodeBase<spvtools::opt::Instruction>.previous_node_ = (Instruction *)0x0;
    (local_140->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
    super_IntrusiveNodeBase<spvtools::opt::Instruction>._vptr_IntrusiveNodeBase =
         (_func_int **)&PTR__Instruction_003e9ae0;
    (local_140->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.unique_id_ = 0;
    (local_140->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.context_ =
         (IRContext *)0x0;
    *(undefined8 *)
     ((long)&(local_140->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.context_
     + 6) = 0;
    (local_140->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.operands_.
    super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (local_140->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.operands_.
    super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (local_140->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.operands_.
    super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (local_140->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.dbg_line_insts_.
    super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (local_140->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.dbg_line_insts_.
    super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (local_140->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.dbg_line_insts_.
    super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (local_140->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.dbg_scope_.
    lexical_scope_ = 0;
    (local_140->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.dbg_scope_.
    inlined_at_ = 0;
    (local_140->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
    super_IntrusiveNodeBase<spvtools::opt::Instruction>.next_node_ = (Instruction *)local_b0._16_8_;
    (local_140->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
    super_IntrusiveNodeBase<spvtools::opt::Instruction>.previous_node_ =
         (Instruction *)local_b0._16_8_;
    (local_140->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
    super_IntrusiveNodeBase<spvtools::opt::Instruction>.is_sentinel_ = true;
    (local_140->insts_).super_IntrusiveList<spvtools::opt::Instruction>._vptr_IntrusiveList =
         (_func_int **)&PTR__InstructionList_003e9b78;
    local_b0._0_8_ = (this->super_InstrumentPass).super_Pass.context_;
    local_b0._24_4_ = kAnalysisInstrToBlockMapping|kAnalysisBegin;
    local_138._12_4_ = local_144 + 3;
    local_b0._8_8_ = local_140;
    uVar9 = GetOutputBufferId(this);
    uVar10 = GetOutputBufferPtrId(this);
    uVar11 = InstructionBuilder::GetUintConstantId((InstructionBuilder *)local_b0,1);
    local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)operator_new(4);
    local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish =
         (pointer)((long)&((__node_base_ptr)
                          local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start)->_M_nxt + 4);
    *(uint32_t *)
     &((__node_base_ptr)
      local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start)->_M_nxt = uVar11;
    local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    pIVar16 = InstructionBuilder::AddAccessChain
                        ((InstructionBuilder *)local_b0,uVar10,uVar9,&local_48);
    if ((__node_base_ptr)
        local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (__node_base_ptr)0x0) {
      operator_delete(local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    uVar9 = InstructionBuilder::GetUintConstantId((InstructionBuilder *)local_b0,local_138._12_4_);
    uVar10 = InstructionBuilder::GetUintConstantId((InstructionBuilder *)local_b0,0);
    uVar11 = InstructionBuilder::GetUintConstantId((InstructionBuilder *)local_b0,4);
    uVar12 = InstrumentPass::GetUintId(&this->super_InstrumentPass);
    uVar13 = 0;
    if (pIVar16->has_result_id_ == true) {
      uVar13 = Instruction::GetSingleWordOperand(pIVar16,(uint)pIVar16->has_type_id_);
    }
    pIVar16 = InstructionBuilder::AddQuadOp
                        ((InstructionBuilder *)local_b0,uVar12,OpAtomicIAdd,uVar13,uVar11,uVar10,
                         uVar9);
    uVar10 = 0;
    uVar9 = 0;
    if (pIVar16->has_result_id_ == true) {
      uVar9 = Instruction::GetSingleWordOperand(pIVar16,(uint)pIVar16->has_type_id_);
    }
    uVar11 = InstrumentPass::GetUintId(&this->super_InstrumentPass);
    uVar12 = InstructionBuilder::GetUintConstantId((InstructionBuilder *)local_b0,local_138._12_4_);
    pIVar16 = InstructionBuilder::AddIAdd((InstructionBuilder *)local_b0,uVar11,uVar9,uVar12);
    uVar11 = InstrumentPass::GetUintId(&this->super_InstrumentPass);
    uVar12 = GetOutputBufferId(this);
    this_02 = InstructionBuilder::AddIdLiteralOp
                        ((InstructionBuilder *)local_b0,uVar11,OpArrayLength,uVar12,2);
    uVar11 = InstrumentPass::GetBoolId(&this->super_InstrumentPass);
    if (pIVar16->has_result_id_ == true) {
      uVar10 = Instruction::GetSingleWordOperand(pIVar16,(uint)pIVar16->has_type_id_);
    }
    uVar13 = 0;
    uVar12 = 0;
    if (this_02->has_result_id_ == true) {
      uVar12 = Instruction::GetSingleWordOperand(this_02,(uint)this_02->has_type_id_);
    }
    pIVar16 = InstructionBuilder::AddBinaryOp
                        ((InstructionBuilder *)local_b0,uVar11,OpULessThanEqual,uVar10,uVar12);
    uVar10 = Pass::TakeNextId((Pass *)this);
    uVar11 = Pass::TakeNextId((Pass *)this);
    InstrumentPass::NewLabel((InstrumentPass *)(local_c8 + 8),func_id);
    InstrumentPass::NewLabel((InstrumentPass *)local_c8,func_id);
    if (pIVar16->has_result_id_ == true) {
      uVar13 = Instruction::GetSingleWordOperand(pIVar16,(uint)pIVar16->has_type_id_);
    }
    InstructionBuilder::AddConditionalBranch
              ((InstructionBuilder *)local_b0,uVar13,uVar11,uVar10,uVar10,0);
    local_e8[0]._M_nxt = (_Hash_node_base *)local_140;
    local_140 = (BasicBlock *)0x0;
    local_110 = (IRContext *)0x0;
    cVar3._M_current =
         (((vector<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
            *)(local_138._0_8_ + 0x98))->
         super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
         )._M_impl.super__Vector_impl_data._M_finish;
    ((BasicBlock *)local_e8[0]._M_nxt)->function_ = (Function *)local_138._0_8_;
    local_108._0_8_ = (BasicBlock *)0x0;
    std::
    vector<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
    ::_M_insert_rval((vector<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
                      *)(local_138._0_8_ + 0x98),cVar3,(value_type *)local_e8);
    if ((BasicBlock *)local_e8[0]._M_nxt != (BasicBlock *)0x0) {
      std::default_delete<spvtools::opt::BasicBlock>::operator()
                ((default_delete<spvtools::opt::BasicBlock> *)local_e8,
                 (BasicBlock *)local_e8[0]._M_nxt);
    }
    if ((BasicBlock *)local_108._0_8_ != (BasicBlock *)0x0) {
      std::default_delete<spvtools::opt::BasicBlock>::operator()
                ((default_delete<spvtools::opt::BasicBlock> *)&local_108,
                 (BasicBlock *)local_108._0_8_);
    }
    if (local_110 != (IRContext *)0x0) {
      std::default_delete<spvtools::opt::BasicBlock>::operator()
                ((default_delete<spvtools::opt::BasicBlock> *)&local_110,(BasicBlock *)local_110);
    }
    local_110 = (IRContext *)0x0;
    pBVar17 = (BasicBlock *)operator_new(0x88);
    uVar5 = local_c8._0_8_;
    pBVar4 = local_140;
    local_c8._0_8_ = (Instruction *)0x0;
    pBVar17->function_ = (Function *)0x0;
    (pBVar17->label_)._M_t.
    super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
    ._M_t.
    super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
    .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl = (Instruction *)uVar5;
    pIVar16 = &(pBVar17->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_;
    (pBVar17->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
    super_IntrusiveNodeBase<spvtools::opt::Instruction>.next_node_ = (Instruction *)0x0;
    (pBVar17->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
    super_IntrusiveNodeBase<spvtools::opt::Instruction>.previous_node_ = (Instruction *)0x0;
    (pBVar17->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
    super_IntrusiveNodeBase<spvtools::opt::Instruction>._vptr_IntrusiveNodeBase =
         (_func_int **)&PTR__Instruction_003e9ae0;
    (pBVar17->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.unique_id_ = 0;
    (pBVar17->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.context_ =
         (IRContext *)0x0;
    *(undefined8 *)
     ((long)&(pBVar17->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.context_ +
     6) = 0;
    (pBVar17->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.operands_.
    super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (pBVar17->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.operands_.
    super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (pBVar17->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.operands_.
    super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (pBVar17->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.dbg_line_insts_.
    super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (pBVar17->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.dbg_line_insts_.
    super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (pBVar17->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.dbg_line_insts_.
    super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (pBVar17->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.dbg_scope_.
    lexical_scope_ = 0;
    (pBVar17->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.dbg_scope_.
    inlined_at_ = 0;
    (pBVar17->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
    super_IntrusiveNodeBase<spvtools::opt::Instruction>.next_node_ = pIVar16;
    (pBVar17->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
    super_IntrusiveNodeBase<spvtools::opt::Instruction>.previous_node_ = pIVar16;
    (pBVar17->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
    super_IntrusiveNodeBase<spvtools::opt::Instruction>.is_sentinel_ = true;
    (pBVar17->insts_).super_IntrusiveList<spvtools::opt::Instruction>._vptr_IntrusiveList =
         (_func_int **)&PTR__InstructionList_003e9b78;
    local_e8[0]._M_nxt = (_Hash_node_base *)0x0;
    bVar20 = local_140 != (BasicBlock *)0x0;
    local_140 = pBVar17;
    if (bVar20) {
      std::default_delete<spvtools::opt::BasicBlock>::operator()
                ((default_delete<spvtools::opt::BasicBlock> *)&local_140,pBVar4);
    }
    if ((BasicBlock *)local_e8[0]._M_nxt != (BasicBlock *)0x0) {
      std::default_delete<spvtools::opt::BasicBlock>::operator()
                ((default_delete<spvtools::opt::BasicBlock> *)local_e8,
                 (BasicBlock *)local_e8[0]._M_nxt);
    }
    local_b0._8_8_ = local_140;
    local_b0._16_8_ = &(local_140->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_
    ;
    uVar11 = InstructionBuilder::GetUintConstantId((InstructionBuilder *)local_b0,local_138._12_4_);
    GenDebugOutputFieldCode(this,uVar9,0,uVar11,(InstructionBuilder *)local_b0);
    GenDebugOutputFieldCode
              (this,uVar9,1,
               *local_80.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start,(InstructionBuilder *)local_b0);
    GenDebugOutputFieldCode
              (this,uVar9,2,
               local_80.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start[1],(InstructionBuilder *)local_b0);
    if (local_144 != 0) {
      uVar18 = 2;
      do {
        GenDebugOutputFieldCode
                  (this,uVar9,(uint32_t)(uVar18 + 1),
                   local_80.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar18 & 0xffffffff],
                   (InstructionBuilder *)local_b0);
        uVar19 = uVar18 - 1;
        uVar18 = uVar18 + 1;
      } while (uVar19 < local_144);
    }
    InstructionBuilder::AddBranch((InstructionBuilder *)local_b0,uVar10);
    local_e8[0]._M_nxt = (_Hash_node_base *)local_140;
    local_140 = (BasicBlock *)0x0;
    local_118 = (BasicBlock *)0x0;
    cVar3._M_current =
         (((vector<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
            *)(local_138._0_8_ + 0x98))->
         super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
         )._M_impl.super__Vector_impl_data._M_finish;
    ((BasicBlock *)local_e8[0]._M_nxt)->function_ = (Function *)local_138._0_8_;
    local_108._0_8_ = (BasicBlock *)0x0;
    std::
    vector<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
    ::_M_insert_rval((vector<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
                      *)(local_138._0_8_ + 0x98),cVar3,(value_type *)local_e8);
    if ((BasicBlock *)local_e8[0]._M_nxt != (BasicBlock *)0x0) {
      std::default_delete<spvtools::opt::BasicBlock>::operator()
                ((default_delete<spvtools::opt::BasicBlock> *)local_e8,
                 (BasicBlock *)local_e8[0]._M_nxt);
    }
    this_03 = (IRContext *)local_b0._40_8_;
    if ((BasicBlock *)local_108._0_8_ != (BasicBlock *)0x0) {
      std::default_delete<spvtools::opt::BasicBlock>::operator()
                ((default_delete<spvtools::opt::BasicBlock> *)&local_108,
                 (BasicBlock *)local_108._0_8_);
    }
    if (local_118 != (BasicBlock *)0x0) {
      std::default_delete<spvtools::opt::BasicBlock>::operator()
                ((default_delete<spvtools::opt::BasicBlock> *)&local_118,local_118);
    }
    local_118 = (BasicBlock *)0x0;
    pBVar17 = (BasicBlock *)operator_new(0x88);
    uVar5 = local_c8._8_8_;
    pBVar4 = local_140;
    local_c8._8_8_ = (Instruction *)0x0;
    pBVar17->function_ = (Function *)0x0;
    (pBVar17->label_)._M_t.
    super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
    ._M_t.
    super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
    .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl = (Instruction *)uVar5;
    pIVar16 = &(pBVar17->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_;
    (pBVar17->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
    super_IntrusiveNodeBase<spvtools::opt::Instruction>.next_node_ = (Instruction *)0x0;
    (pBVar17->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
    super_IntrusiveNodeBase<spvtools::opt::Instruction>.previous_node_ = (Instruction *)0x0;
    (pBVar17->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
    super_IntrusiveNodeBase<spvtools::opt::Instruction>._vptr_IntrusiveNodeBase =
         (_func_int **)&PTR__Instruction_003e9ae0;
    (pBVar17->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.unique_id_ = 0;
    (pBVar17->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.context_ =
         (IRContext *)0x0;
    *(undefined8 *)
     ((long)&(pBVar17->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.context_ +
     6) = 0;
    (pBVar17->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.operands_.
    super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (pBVar17->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.operands_.
    super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (pBVar17->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.operands_.
    super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (pBVar17->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.dbg_line_insts_.
    super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (pBVar17->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.dbg_line_insts_.
    super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (pBVar17->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.dbg_line_insts_.
    super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (pBVar17->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.dbg_scope_.
    lexical_scope_ = 0;
    (pBVar17->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.dbg_scope_.
    inlined_at_ = 0;
    (pBVar17->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
    super_IntrusiveNodeBase<spvtools::opt::Instruction>.next_node_ = pIVar16;
    (pBVar17->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
    super_IntrusiveNodeBase<spvtools::opt::Instruction>.previous_node_ = pIVar16;
    (pBVar17->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
    super_IntrusiveNodeBase<spvtools::opt::Instruction>.is_sentinel_ = true;
    (pBVar17->insts_).super_IntrusiveList<spvtools::opt::Instruction>._vptr_IntrusiveList =
         (_func_int **)&PTR__InstructionList_003e9b78;
    local_e8[0]._M_nxt = (_Hash_node_base *)0x0;
    bVar20 = local_140 != (BasicBlock *)0x0;
    local_140 = pBVar17;
    if (bVar20) {
      std::default_delete<spvtools::opt::BasicBlock>::operator()
                ((default_delete<spvtools::opt::BasicBlock> *)&local_140,pBVar4);
    }
    if ((BasicBlock *)local_e8[0]._M_nxt != (BasicBlock *)0x0) {
      std::default_delete<spvtools::opt::BasicBlock>::operator()
                ((default_delete<spvtools::opt::BasicBlock> *)local_e8,
                 (BasicBlock *)local_e8[0]._M_nxt);
    }
    local_b0._8_8_ = local_140;
    local_b0._16_8_ = &(local_140->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_
    ;
    InstructionBuilder::AddNullaryOp((InstructionBuilder *)local_b0,0,OpReturn);
    local_e8[0]._M_nxt = (_Hash_node_base *)local_140;
    local_140 = (BasicBlock *)0x0;
    local_120 = (BasicBlock *)0x0;
    cVar3._M_current =
         (((vector<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
            *)(local_138._0_8_ + 0x98))->
         super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
         )._M_impl.super__Vector_impl_data._M_finish;
    ((BasicBlock *)local_e8[0]._M_nxt)->function_ = (Function *)local_138._0_8_;
    local_108._0_8_ = (BasicBlock *)0x0;
    std::
    vector<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
    ::_M_insert_rval((vector<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
                      *)(local_138._0_8_ + 0x98),cVar3,(value_type *)local_e8);
    if ((BasicBlock *)local_e8[0]._M_nxt != (BasicBlock *)0x0) {
      std::default_delete<spvtools::opt::BasicBlock>::operator()
                ((default_delete<spvtools::opt::BasicBlock> *)local_e8,
                 (BasicBlock *)local_e8[0]._M_nxt);
    }
    if ((BasicBlock *)local_108._0_8_ != (BasicBlock *)0x0) {
      std::default_delete<spvtools::opt::BasicBlock>::operator()
                ((default_delete<spvtools::opt::BasicBlock> *)&local_108,
                 (BasicBlock *)local_108._0_8_);
    }
    if (local_120 != (BasicBlock *)0x0) {
      std::default_delete<spvtools::opt::BasicBlock>::operator()
                ((default_delete<spvtools::opt::BasicBlock> *)&local_120,local_120);
    }
    uVar5 = local_138._0_8_;
    local_120 = (BasicBlock *)0x0;
    InstrumentPass::EndFunction((InstrumentPass *)local_b8);
    auVar6 = local_b8;
    local_b8 = (undefined1  [8])0x0;
    pIVar16 = (((unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                 *)(uVar5 + 0xb0))->_M_t).
              super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
              ._M_t.
              super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
              .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
    (((unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_> *)
     (uVar5 + 0xb0))->_M_t).
    super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
    ._M_t.
    super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
    .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl = (Instruction *)auVar6
    ;
    if (pIVar16 != (Instruction *)0x0) {
      (**(code **)((long)(pIVar16->super_IntrusiveNodeBase<spvtools::opt::Instruction>).
                         _vptr_IntrusiveNodeBase + 8))();
    }
    if (local_b8 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_b8 + 8))();
    }
    local_b8 = (undefined1  [8])0x0;
    local_e8[0]._M_nxt = (_Hash_node_base *)local_138._0_8_;
    local_138._0_8_ =
         (__uniq_ptr_impl<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>)
         0x0;
    std::
    vector<std::unique_ptr<spvtools::opt::Function,std::default_delete<spvtools::opt::Function>>,std::allocator<std::unique_ptr<spvtools::opt::Function,std::default_delete<spvtools::opt::Function>>>>
    ::
    emplace_back<std::unique_ptr<spvtools::opt::Function,std::default_delete<spvtools::opt::Function>>>
              ((vector<std::unique_ptr<spvtools::opt::Function,std::default_delete<spvtools::opt::Function>>,std::allocator<std::unique_ptr<spvtools::opt::Function,std::default_delete<spvtools::opt::Function>>>>
                *)&((((this->super_InstrumentPass).super_Pass.context_)->module_)._M_t.
                    super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
                    .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl)->functions_
               ,(unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>
                 *)local_e8);
    std::unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>::
    ~unique_ptr((unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>
                 *)local_e8);
    local_e8[0]._M_nxt = local_d8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_e8,"stream_write_","");
    uVar9 = local_144;
    cVar8 = '\x01';
    if (9 < local_144) {
      uVar10 = local_144;
      cVar7 = '\x04';
      do {
        cVar8 = cVar7;
        if (uVar10 < 100) {
          cVar8 = cVar8 + -2;
          goto LAB_00227f6f;
        }
        if (uVar10 < 1000) {
          cVar8 = cVar8 + -1;
          goto LAB_00227f6f;
        }
        if (uVar10 < 10000) goto LAB_00227f6f;
        bVar20 = 99999 < uVar10;
        uVar10 = uVar10 / 10000;
        cVar7 = cVar8 + '\x04';
      } while (bVar20);
      cVar8 = cVar8 + '\x01';
    }
LAB_00227f6f:
    local_108._0_8_ = (BasicBlock *)local_f8;
    std::__cxx11::string::_M_construct((ulong)&local_108,cVar8);
    std::__detail::__to_chars_10_impl<unsigned_int>
              ((char *)local_108._0_8_,(uint)local_108.second,uVar9);
    std::__cxx11::string::_M_append((char *)local_e8,local_108._0_8_);
    if ((BasicBlock *)local_108._0_8_ != (BasicBlock *)local_f8) {
      operator_delete((void *)local_108._0_8_,local_f8._0_8_ + 1);
    }
    pIVar2 = (this->super_InstrumentPass).super_Pass.context_;
    pmVar14 = std::__detail::
              _Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)this_03,&local_144);
    NewGlobalName((InstDebugPrintfPass *)(local_138 + 0x10),func_id,(string *)(ulong)*pmVar14);
    if (((pIVar2->valid_analyses_ & kAnalysisNameMap) != kAnalysisNone) &&
       (*(Op *)(local_138._16_8_ + 0x28) - OpName < 2)) {
      this_01 = (_Rb_tree<unsigned_int,std::pair<unsigned_int_const,spvtools::opt::Instruction*>,std::_Select1st<std::pair<unsigned_int_const,spvtools::opt::Instruction*>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,spvtools::opt::Instruction*>>>
                 *)(pIVar2->id_to_name_)._M_t.
                   super___uniq_ptr_impl<std::multimap<unsigned_int,_spvtools::opt::Instruction_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>_>,_std::default_delete<std::multimap<unsigned_int,_spvtools::opt::Instruction_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>_>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_std::multimap<unsigned_int,_spvtools::opt::Instruction_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>_>_*,_std::default_delete<std::multimap<unsigned_int,_spvtools::opt::Instruction_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>_>_>_>
                   .
                   super__Head_base<0UL,_std::multimap<unsigned_int,_spvtools::opt::Instruction_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>_>_*,_false>
                   ._M_head_impl;
      uVar9 = (*(bool *)(local_138._16_8_ + 0x2d) & 1) + 1;
      if (*(bool *)(local_138._16_8_ + 0x2c) == false) {
        uVar9 = (uint)*(bool *)(local_138._16_8_ + 0x2d);
      }
      uVar9 = Instruction::GetSingleWordOperand((Instruction *)local_138._16_8_,uVar9);
      local_108.first = uVar9;
      local_108.second = (Instruction *)local_138._16_8_;
      std::
      _Rb_tree<unsigned_int,std::pair<unsigned_int_const,spvtools::opt::Instruction*>,std::_Select1st<std::pair<unsigned_int_const,spvtools::opt::Instruction*>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,spvtools::opt::Instruction*>>>
      ::_M_insert_equal<std::pair<unsigned_int_const,spvtools::opt::Instruction*>>
                (this_01,&local_108);
    }
    if ((pIVar2->valid_analyses_ & kAnalysisBegin) != kAnalysisNone) {
      analysis::DefUseManager::AnalyzeInstDefUse
                ((pIVar2->def_use_mgr_)._M_t.
                 super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                 .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>.
                 _M_head_impl,(Instruction *)local_138._16_8_);
    }
    uVar5 = local_138._16_8_;
    local_138._16_8_ = (Instruction *)0x0;
    utils::IntrusiveList<spvtools::opt::Instruction>::push_back
              (&(((pIVar2->module_)._M_t.
                  super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
                  .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl)->debugs2_).
                super_IntrusiveList<spvtools::opt::Instruction>,(Instruction *)uVar5);
    if ((Instruction *)local_138._16_8_ != (Instruction *)0x0) {
      (**(code **)(*(long *)local_138._16_8_ + 8))();
    }
    if (local_e8[0]._M_nxt != local_d8) {
      operator_delete(local_e8[0]._M_nxt,(ulong)((long)&(local_d8[0]._M_nxt)->_M_nxt + 1));
    }
    if ((Instruction *)local_c8._0_8_ != (Instruction *)0x0) {
      (*((IntrusiveNodeBase<spvtools::opt::Instruction> *)local_c8._0_8_)->_vptr_IntrusiveNodeBase
        [1])();
    }
    if ((Instruction *)local_c8._8_8_ != (Instruction *)0x0) {
      (**(code **)(*(long *)local_c8._8_8_ + 8))();
    }
    if (local_140 != (BasicBlock *)0x0) {
      std::default_delete<spvtools::opt::BasicBlock>::operator()
                ((default_delete<spvtools::opt::BasicBlock> *)&local_140,local_140);
    }
    if (local_80.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (uint32_t *)0x0) {
      operator_delete(local_80.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_80.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_80.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    std::unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>::
    ~unique_ptr((unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>
                 *)local_138);
    if ((_Hash_node_base *)
        local_68.
        super__Vector_base<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
        ._M_impl.super__Vector_impl_data._M_start != (_Hash_node_base *)0x0) {
      operator_delete(local_68.
                      super__Vector_base<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_68.
                            super__Vector_base<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_68.
                            super__Vector_base<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  pmVar14 = std::__detail::
            _Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
            ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          *)this_03,&local_144);
  return *pmVar14;
}

Assistant:

uint32_t InstDebugPrintfPass::GetStreamWriteFunctionId(uint32_t param_cnt) {
  enum {
    kShaderId = 0,
    kInstructionIndex = 1,
    kFirstParam = 2,
  };
  // Total param count is common params plus validation-specific
  // params
  if (param2output_func_id_[param_cnt] == 0) {
    // Create function
    param2output_func_id_[param_cnt] = TakeNextId();
    analysis::TypeManager* type_mgr = context()->get_type_mgr();

    const analysis::Type* uint_type = GetInteger(32, false);

    std::vector<const analysis::Type*> param_types(kFirstParam + param_cnt,
                                                   uint_type);
    std::unique_ptr<Function> output_func = StartFunction(
        param2output_func_id_[param_cnt], type_mgr->GetVoidType(), param_types);

    std::vector<uint32_t> param_ids = AddParameters(*output_func, param_types);

    // Create first block
    auto new_blk_ptr = MakeUnique<BasicBlock>(NewLabel(TakeNextId()));

    InstructionBuilder builder(
        context(), &*new_blk_ptr,
        IRContext::kAnalysisDefUse | IRContext::kAnalysisInstrToBlockMapping);
    // Gen test if debug output buffer size will not be exceeded.
    const uint32_t first_param_offset = kInstCommonOutInstructionIdx + 1;
    const uint32_t obuf_record_sz = first_param_offset + param_cnt;
    const uint32_t buf_id = GetOutputBufferId();
    const uint32_t buf_uint_ptr_id = GetOutputBufferPtrId();
    Instruction* obuf_curr_sz_ac_inst = builder.AddAccessChain(
        buf_uint_ptr_id, buf_id,
        {builder.GetUintConstantId(kDebugOutputSizeOffset)});
    // Fetch the current debug buffer written size atomically, adding the
    // size of the record to be written.
    uint32_t obuf_record_sz_id = builder.GetUintConstantId(obuf_record_sz);
    uint32_t mask_none_id =
        builder.GetUintConstantId(uint32_t(spv::MemoryAccessMask::MaskNone));
    uint32_t scope_invok_id =
        builder.GetUintConstantId(uint32_t(spv::Scope::Invocation));
    Instruction* obuf_curr_sz_inst = builder.AddQuadOp(
        GetUintId(), spv::Op::OpAtomicIAdd, obuf_curr_sz_ac_inst->result_id(),
        scope_invok_id, mask_none_id, obuf_record_sz_id);
    uint32_t obuf_curr_sz_id = obuf_curr_sz_inst->result_id();
    // Compute new written size
    Instruction* obuf_new_sz_inst =
        builder.AddIAdd(GetUintId(), obuf_curr_sz_id,
                        builder.GetUintConstantId(obuf_record_sz));
    // Fetch the data bound
    Instruction* obuf_bnd_inst =
        builder.AddIdLiteralOp(GetUintId(), spv::Op::OpArrayLength,
                               GetOutputBufferId(), kDebugOutputDataOffset);
    // Test that new written size is less than or equal to debug output
    // data bound
    Instruction* obuf_safe_inst = builder.AddBinaryOp(
        GetBoolId(), spv::Op::OpULessThanEqual, obuf_new_sz_inst->result_id(),
        obuf_bnd_inst->result_id());
    uint32_t merge_blk_id = TakeNextId();
    uint32_t write_blk_id = TakeNextId();
    std::unique_ptr<Instruction> merge_label(NewLabel(merge_blk_id));
    std::unique_ptr<Instruction> write_label(NewLabel(write_blk_id));
    (void)builder.AddConditionalBranch(
        obuf_safe_inst->result_id(), write_blk_id, merge_blk_id, merge_blk_id,
        uint32_t(spv::SelectionControlMask::MaskNone));
    // Close safety test block and gen write block
    output_func->AddBasicBlock(std::move(new_blk_ptr));
    new_blk_ptr = MakeUnique<BasicBlock>(std::move(write_label));
    builder.SetInsertPoint(&*new_blk_ptr);
    // Generate common and stage-specific debug record members
    GenDebugOutputFieldCode(obuf_curr_sz_id, kInstCommonOutSize,
                            builder.GetUintConstantId(obuf_record_sz),
                            &builder);
    // Store Shader Id
    GenDebugOutputFieldCode(obuf_curr_sz_id, kInstCommonOutShaderId,
                            param_ids[kShaderId], &builder);
    // Store Instruction Idx
    GenDebugOutputFieldCode(obuf_curr_sz_id, kInstCommonOutInstructionIdx,
                            param_ids[kInstructionIndex], &builder);
    // Gen writes of validation specific data
    for (uint32_t i = 0; i < param_cnt; ++i) {
      GenDebugOutputFieldCode(obuf_curr_sz_id, first_param_offset + i,
                              param_ids[kFirstParam + i], &builder);
    }
    // Close write block and gen merge block
    (void)builder.AddBranch(merge_blk_id);
    output_func->AddBasicBlock(std::move(new_blk_ptr));
    new_blk_ptr = MakeUnique<BasicBlock>(std::move(merge_label));
    builder.SetInsertPoint(&*new_blk_ptr);
    // Close merge block and function and add function to module
    (void)builder.AddNullaryOp(0, spv::Op::OpReturn);

    output_func->AddBasicBlock(std::move(new_blk_ptr));
    output_func->SetFunctionEnd(EndFunction());
    context()->AddFunction(std::move(output_func));

    std::string name("stream_write_");
    name += std::to_string(param_cnt);

    context()->AddDebug2Inst(
        NewGlobalName(param2output_func_id_[param_cnt], name));
  }
  return param2output_func_id_[param_cnt];
}